

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ExtensionPackTestCase::init
          (ExtensionPackTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  string local_40;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ANDROID_extension_pack_es31a");
  if (bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Test requires GL_ANDROID_extension_pack_es31a extension","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExtensionPackTestCase::init (void)
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ANDROID_extension_pack_es31a"))
		throw tcu::NotSupportedError("Test requires GL_ANDROID_extension_pack_es31a extension");
}